

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validExrFile.cpp
# Opt level: O0

bool isComplete(char *fileName)

{
  byte bVar1;
  int iVar2;
  char *in_RDI;
  InputFile in;
  InputFile *this;
  InputFile local_28 [40];
  
  iVar2 = Imf_3_4::globalThreadCount();
  this = local_28;
  Imf_3_4::InputFile::InputFile(this,in_RDI,iVar2);
  bVar1 = Imf_3_4::InputFile::isComplete();
  Imf_3_4::InputFile::~InputFile(this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
isComplete (const char fileName[])
{
    InputFile in (fileName);
    return in.isComplete();
}